

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

Vec_Wec_t * Sbd_ManWindowRoots(Gia_Man_t *p,int nTfoLevels,int nTfoFanMax)

{
  uint *puVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  uint *__ptr;
  void *pvVar7;
  int *__ptr_00;
  void *pvVar8;
  long lVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  ulong uVar15;
  int Fill;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *piVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int *piVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  size_t __size;
  ulong uVar26;
  uint local_7c;
  
  uVar12 = p->nObjs;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  uVar25 = 8;
  if (6 < uVar12 - 1) {
    uVar25 = uVar12;
  }
  pVVar5->nCap = uVar25;
  if (uVar25 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)(int)uVar25,0x10);
  }
  pVVar5->pArray = pVVar6;
  pVVar5->nSize = uVar12;
  __ptr = (uint *)malloc(0x10);
  *__ptr = uVar25;
  if (uVar25 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = calloc((long)(int)uVar25,0x10);
  }
  *(void **)(__ptr + 2) = pvVar7;
  __ptr[1] = uVar12;
  iVar24 = (((int)uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0);
  __ptr_00 = (int *)malloc(0x10);
  *__ptr_00 = iVar24 * 0x20;
  if (iVar24 == 0) {
    __size = 0;
    pvVar8 = (void *)0x0;
  }
  else {
    __size = (long)iVar24 << 2;
    pvVar8 = malloc(__size);
  }
  *(void **)(__ptr_00 + 2) = pvVar8;
  __ptr_00[1] = iVar24 * 0x20;
  memset(pvVar8,0,__size);
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark0(p);
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar22 = 0;
    do {
      iVar24 = pVVar6->pArray[lVar22];
      if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) goto LAB_0053928b;
      if (iVar24 == 0) break;
      if ((int)uVar12 <= iVar24) goto LAB_0053924d;
      lVar9 = (long)iVar24 * 0x10;
      pVVar6 = (Vec_Int_t *)((long)pvVar7 + lVar9);
      if (*(int *)((long)pvVar7 + lVar9) < 1) {
        if (pVVar6->pArray == (int *)0x0) {
          piVar10 = (int *)malloc(4);
        }
        else {
          piVar10 = (int *)realloc(pVVar6->pArray,4);
        }
        pVVar6->pArray = piVar10;
        if (piVar10 == (int *)0x0) goto LAB_00539364;
        pVVar6->nCap = 1;
      }
      Vec_IntPush(pVVar6,iVar24);
      lVar22 = lVar22 + 1;
      pVVar6 = p->vCis;
    } while (lVar22 < pVVar6->nSize);
  }
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    piVar10 = pVVar6->pArray;
    lVar22 = 0;
    do {
      iVar24 = piVar10[lVar22];
      if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) {
LAB_0053928b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar12 = iVar24 - (*(uint *)(p->pObjs + iVar24) & 0x1fffffff);
      if (((int)uVar12 < 0) || (__ptr_00[1] <= (int)uVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)(*(long *)(__ptr_00 + 2) + (ulong)(uVar12 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar12 & 0x1f);
      lVar22 = lVar22 + 1;
    } while (lVar22 < pVVar6->nSize);
  }
  if (0 < p->nObjs) {
    uVar26 = 0;
    do {
      uVar12 = (uint)*(undefined8 *)(p->pObjs + uVar26);
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        if ((long)__ptr_00[1] <= (long)uVar26) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar25 = (uint)uVar26;
        bVar4 = true;
        if ((*(uint *)(*(long *)(__ptr_00 + 2) + (uVar26 >> 5 & 0x7ffffff) * 4) >> (uVar25 & 0x1f) &
            1) == 0) {
          bVar4 = nTfoFanMax <= p->pRefs[uVar26];
        }
        uVar12 = uVar25 - (uVar12 & 0x1fffffff);
        if ((int)uVar12 < 0) {
LAB_0053924d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar21 = __ptr[1];
        if (((((int)uVar21 <= (int)uVar12) ||
             (uVar18 = uVar25 - ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar26) >> 0x20) &
                                0x1fffffff), (int)uVar18 < 0)) || (uVar21 <= uVar18)) ||
           (uVar21 <= uVar26)) goto LAB_0053924d;
        lVar22 = *(long *)(__ptr + 2);
        lVar9 = (ulong)uVar12 * 0x10 + lVar22;
        lVar23 = (ulong)uVar18 * 0x10 + lVar22;
        lVar19 = uVar26 * 0x10;
        pVVar6 = (Vec_Int_t *)(lVar22 + lVar19);
        iVar13 = *(int *)(lVar9 + 4);
        iVar17 = *(int *)(lVar23 + 4);
        iVar24 = iVar17 + iVar13;
        piVar10 = *(int **)(lVar22 + 8 + lVar19);
        if (*(int *)(lVar22 + lVar19) < iVar24) {
          if (piVar10 == (int *)0x0) {
            piVar10 = (int *)malloc((long)iVar24 << 2);
          }
          else {
            piVar10 = (int *)realloc(piVar10,(long)iVar24 << 2);
          }
          pVVar6->pArray = piVar10;
          if (piVar10 == (int *)0x0) {
LAB_00539364:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar6->nCap = iVar24;
          iVar13 = *(int *)(lVar9 + 4);
          iVar17 = *(int *)(lVar23 + 4);
        }
        piVar20 = *(int **)(lVar9 + 8);
        piVar16 = *(int **)(lVar23 + 8);
        piVar2 = piVar20 + iVar13;
        piVar3 = piVar16 + iVar17;
        piVar14 = piVar10;
        if ((0 < iVar13) && (0 < iVar17)) {
          do {
            iVar24 = *piVar20;
            iVar13 = *piVar16;
            if (iVar24 == iVar13) {
              piVar20 = piVar20 + 1;
              *piVar14 = iVar24;
              piVar16 = piVar16 + 1;
            }
            else if (iVar24 < iVar13) {
              piVar20 = piVar20 + 1;
              *piVar14 = iVar24;
            }
            else {
              piVar16 = piVar16 + 1;
              *piVar14 = iVar13;
            }
            piVar14 = piVar14 + 1;
          } while ((piVar20 < piVar2) && (piVar16 < piVar3));
        }
        for (; piVar20 < piVar2; piVar20 = piVar20 + 1) {
          *piVar14 = *piVar20;
          piVar14 = piVar14 + 1;
        }
        for (; piVar16 < piVar3; piVar16 = piVar16 + 1) {
          *piVar14 = *piVar16;
          piVar14 = piVar14 + 1;
        }
        iVar24 = (int)((ulong)((long)piVar14 - (long)piVar10) >> 2);
        pVVar6->nSize = iVar24;
        if (pVVar6->nCap < iVar24) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72c,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar24 < *(int *)(lVar9 + 4)) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72d,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar24 < *(int *)(lVar23 + 4)) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x72e,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar24 < 1) {
          local_7c = 0;
        }
        else {
          lVar22 = 0;
          local_7c = 0;
          do {
            uVar12 = pVVar6->pArray[lVar22];
            if (bVar4) {
              iVar24 = pVVar5->nSize;
              if (iVar24 <= (int)uVar12) {
                iVar17 = uVar12 + 1;
                iVar13 = iVar24 * 2;
                if (iVar24 * 2 <= iVar17) {
                  iVar13 = iVar17;
                }
                iVar24 = pVVar5->nCap;
                if (iVar24 < iVar13) {
                  if (pVVar5->pArray == (Vec_Int_t *)0x0) {
                    pVVar11 = (Vec_Int_t *)malloc((long)iVar13 << 4);
                  }
                  else {
                    pVVar11 = (Vec_Int_t *)realloc(pVVar5->pArray,(long)iVar13 << 4);
                  }
                  pVVar5->pArray = pVVar11;
                  memset(pVVar11 + iVar24,0,(long)(iVar13 - iVar24) << 4);
                  pVVar5->nCap = iVar13;
                }
                pVVar5->nSize = iVar17;
                iVar24 = iVar17;
              }
              if (((int)uVar12 < 0) || (iVar24 <= (int)uVar12)) goto LAB_0053924d;
              Vec_IntPush(pVVar5->pArray + uVar12,uVar25 * 2 + 1);
              piVar16 = extraout_RDX;
            }
            else {
              pVVar11 = p->vLevels;
              Vec_IntFillExtra(pVVar11,uVar25 + 1,(int)piVar16);
              if ((long)pVVar11->nSize <= (long)uVar26) {
LAB_0053922e:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar24 = pVVar11->pArray[uVar26];
              pVVar11 = p->vLevels;
              uVar21 = uVar12 + 1;
              Vec_IntFillExtra(pVVar11,uVar21,Fill);
              if (((int)uVar12 < 0) || (pVVar11->nSize <= (int)uVar12)) goto LAB_0053922e;
              iVar24 = iVar24 - pVVar11->pArray[uVar12];
              if (pVVar5->nSize <= (int)uVar12) {
                uVar18 = pVVar5->nSize * 2;
                if ((int)uVar18 <= (int)uVar21) {
                  uVar18 = uVar21;
                }
                iVar13 = pVVar5->nCap;
                if (iVar13 < (int)uVar18) {
                  if (pVVar5->pArray == (Vec_Int_t *)0x0) {
                    pVVar11 = (Vec_Int_t *)malloc((ulong)uVar18 << 4);
                  }
                  else {
                    pVVar11 = (Vec_Int_t *)realloc(pVVar5->pArray,(ulong)uVar18 << 4);
                  }
                  pVVar5->pArray = pVVar11;
                  memset(pVVar11 + iVar13,0,(long)(int)(uVar18 - iVar13) << 4);
                  pVVar5->nCap = uVar18;
                }
                pVVar5->nSize = uVar21;
              }
              Vec_IntPush(pVVar5->pArray + uVar12,(uint)(nTfoLevels <= iVar24) | uVar25 * 2);
              piVar16 = extraout_RDX_00;
              if (iVar24 < nTfoLevels) {
                if (((int)local_7c < 0) || (pVVar6->nSize <= (int)local_7c)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                uVar15 = (ulong)local_7c;
                local_7c = local_7c + 1;
                piVar16 = (int *)(ulong)local_7c;
                pVVar6->pArray[uVar15] = uVar12;
              }
            }
            lVar22 = lVar22 + 1;
            iVar24 = pVVar6->nSize;
          } while (lVar22 < iVar24);
        }
        if (iVar24 < (int)local_7c) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar6->nSize = local_7c;
        if (!bVar4) {
          Vec_IntPush(pVVar6,uVar25);
        }
      }
      uVar26 = uVar26 + 1;
    } while ((long)uVar26 < (long)p->nObjs);
  }
  uVar12 = *__ptr;
  pvVar7 = *(void **)(__ptr + 2);
  if ((long)(int)uVar12 < 1) {
    if (pvVar7 == (void *)0x0) goto LAB_005391f9;
  }
  else {
    lVar22 = 0;
    do {
      pvVar8 = *(void **)((long)pvVar7 + lVar22 + 8);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)pvVar7 + lVar22 + 8) = 0;
      }
      lVar22 = lVar22 + 0x10;
    } while ((long)(int)uVar12 * 0x10 != lVar22);
  }
  free(pvVar7);
LAB_005391f9:
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  return pVVar5;
}

Assistant:

Vec_Wec_t * Sbd_ManWindowRoots( Gia_Man_t * p, int nTfoLevels, int nTfoFanMax )
{
    Vec_Wec_t * vTfos = Vec_WecStart( Gia_ManObjNum(p) ); // TFO nodes with roots marked
    Vec_Wec_t * vTemp = Vec_WecStart( Gia_ManObjNum(p) ); // storage
    Vec_Int_t * vNodes, * vNodes0, * vNodes1;
    Vec_Bit_t * vPoDrivers = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, k2, Id, Fan;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark0( p );
    Gia_ManForEachCiId( p, Id, i )
    {
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntGrow( vNodes, 1 );
        Vec_IntPush( vNodes, Id );
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_BitWriteEntry( vPoDrivers, Id, 1 );
    Gia_ManForEachAndId( p, Id )
    {
        int fAlwaysRoot = Vec_BitEntry(vPoDrivers, Id) || (Gia_ObjRefNumId(p, Id) >= nTfoFanMax);
        vNodes0 = Vec_WecEntry( vTemp, Gia_ObjFaninId0(Gia_ManObj(p, Id), Id) );
        vNodes1 = Vec_WecEntry( vTemp, Gia_ObjFaninId1(Gia_ManObj(p, Id), Id) );
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntTwoMerge2( vNodes0, vNodes1, vNodes );
        k2 = 0;
        Vec_IntForEachEntry( vNodes, Fan, k )
        {
            int fRoot = fAlwaysRoot || (Gia_ObjLevelId(p, Id) - Gia_ObjLevelId(p, Fan) >= nTfoLevels);
            Vec_WecPush( vTfos, Fan, Abc_Var2Lit(Id, fRoot) );
            if ( !fRoot ) Vec_IntWriteEntry( vNodes, k2++, Fan );
        }
        Vec_IntShrink( vNodes, k2 );
        if ( !fAlwaysRoot )
            Vec_IntPush( vNodes, Id );
    }
    Vec_WecFree( vTemp );
    Vec_BitFree( vPoDrivers );

    // print the results
    if ( 0 )
    Vec_WecForEachLevel( vTfos, vNodes, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, i)) )
            continue;
        printf( "Node %3d : ", i );
        Vec_IntForEachEntry( vNodes, Fan, k )
            printf( "%d%s ", Abc_Lit2Var(Fan), Abc_LitIsCompl(Fan)? "*":"" );
        printf( "\n" );
    }

    return vTfos;
}